

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GenerateIndexKey
              (Parse *pParse,Index *pIdx,int iDataCur,int regOut,int prefixOnly,int *piPartIdxLabel,
              Index *pPrior,int regPrior)

{
  byte bVar1;
  ushort uVar2;
  Vdbe *p;
  Expr *pExpr;
  int iVar3;
  long lVar4;
  char *zP4;
  int *piVar5;
  uint nReg;
  ulong uVar6;
  uint addr;
  
  p = pParse->pVdbe;
  if (piPartIdxLabel != (int *)0x0) {
    pExpr = pIdx->pPartIdxWhere;
    if (pExpr == (Expr *)0x0) {
      *piPartIdxLabel = 0;
    }
    else {
      iVar3 = pParse->nLabel + -1;
      pParse->nLabel = iVar3;
      *piPartIdxLabel = iVar3;
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprIfFalseDup(pParse,pExpr,*piPartIdxLabel,regOut);
      pParse->iSelfTab = 0;
    }
  }
  if ((prefixOnly == 0) || (lVar4 = 0x5e, (pIdx->field_0x63 & 8) == 0)) {
    lVar4 = 0x60;
  }
  uVar2 = *(ushort *)((long)&pIdx->zName + lVar4);
  nReg = (uint)uVar2;
  iVar3 = sqlite3GetTempRange(pParse,nReg);
  if (((pPrior == (Index *)0x0) || (iVar3 != regPrior)) || (pPrior->pPartIdxWhere != (Expr *)0x0)) {
    pPrior = (Index *)0x0;
  }
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      if (((pPrior == (Index *)0x0) || (pPrior->aiColumn[uVar6] == -2)) ||
         (pPrior->aiColumn[uVar6] != pIdx->aiColumn[uVar6])) {
        sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,iDataCur,(int)uVar6,iVar3 + (int)uVar6);
        if ((0 < p->nOp) && (addr = p->nOp - 1, p->aOp[addr].opcode == 'T')) {
          sqlite3VdbeChangeToNoop(p,addr);
        }
      }
      uVar6 = uVar6 + 1;
    } while (nReg != uVar6);
  }
  if ((regOut != 0) &&
     (sqlite3VdbeAddOp3(p,0x5c,iVar3,nReg,regOut), pIdx->pTable->pSelect != (Select *)0x0)) {
    zP4 = sqlite3IndexAffinityStr(pParse->db,pIdx);
    sqlite3VdbeChangeP4(p,-1,zP4,0);
  }
  if (nReg == 1) {
    if (iVar3 == 0) {
      return 0;
    }
    bVar1 = pParse->nTempReg;
    if (7 < (ulong)bVar1) {
      return iVar3;
    }
    pParse->nTempReg = bVar1 + 1;
    piVar5 = pParse->aTempReg + bVar1;
  }
  else {
    if ((int)nReg <= pParse->nRangeReg) {
      return iVar3;
    }
    pParse->nRangeReg = nReg;
    piVar5 = &pParse->iRangeReg;
  }
  *piVar5 = iVar3;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,       /* Parsing context */
  Index *pIdx,         /* The index for which to generate a key */
  int iDataCur,        /* Cursor number from which to take column data */
  int regOut,          /* Put the new key into this register if not 0 */
  int prefixOnly,      /* Compute only a unique prefix of the key */
  int *piPartIdxLabel, /* OUT: Jump to this label to skip partial index */
  Index *pPrior,       /* Previously generated index key */
  int regPrior         /* Register holding previous generated key */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  int regBase;
  int nCol;

  if( piPartIdxLabel ){
    if( pIdx->pPartIdxWhere ){
      *piPartIdxLabel = sqlite3VdbeMakeLabel(pParse);
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, *piPartIdxLabel, 
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
    }else{
      *piPartIdxLabel = 0;
    }
  }
  nCol = (prefixOnly && pIdx->uniqNotNull) ? pIdx->nKeyCol : pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol);
  if( pPrior && (regBase!=regPrior || pPrior->pPartIdxWhere) ) pPrior = 0;
  for(j=0; j<nCol; j++){
    if( pPrior
     && pPrior->aiColumn[j]==pIdx->aiColumn[j]
     && pPrior->aiColumn[j]!=XN_EXPR
    ){
      /* This column was already computed by the previous index */
      continue;
    }
    sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iDataCur, j, regBase+j);
    /* If the column affinity is REAL but the number is an integer, then it
    ** might be stored in the table as an integer (using a compact
    ** representation) then converted to REAL by an OP_RealAffinity opcode.
    ** But we are getting ready to store this value back into an index, where
    ** it should be converted by to INTEGER again.  So omit the OP_RealAffinity
    ** opcode if it is present */
    sqlite3VdbeDeletePriorOpcode(v, OP_RealAffinity);
  }
  if( regOut ){
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol, regOut);
    if( pIdx->pTable->pSelect ){
      const char *zAff = sqlite3IndexAffinityStr(pParse->db, pIdx);
      sqlite3VdbeChangeP4(v, -1, zAff, P4_TRANSIENT);
    }
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol);
  return regBase;
}